

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O0

int dig(void)

{
  char cVar1;
  xchar x;
  xchar y;
  boolean bVar2;
  schar sVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  rm *loc_00;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  trap *ptVar10;
  obj *poVar11;
  bool bVar12;
  bool bVar13;
  uint local_a4;
  monst *pmStack_60;
  int dig_target;
  monst *mtmp;
  obj *bobj;
  boolean shopedge;
  obj *obj;
  char *dmgtxt;
  char *digtxt;
  trap *ttmp;
  char *verb;
  boolean ispick;
  xchar dpy;
  xchar dpx;
  rm *loc;
  
  y = digging.pos.y;
  x = digging.pos.x;
  bVar12 = false;
  if ((uwep != (obj *)0x0) && ((uwep->oclass == '\x02' || (bVar12 = false, uwep->oclass == '\x06')))
     ) {
    bVar12 = objects[uwep->otyp].oc_subtyp == '\x04';
  }
  bVar13 = true;
  if ((uwep != (obj *)0x0) && ((uwep->oclass == '\x02' || (bVar13 = false, uwep->oclass == '\x06')))
     ) {
    bVar13 = objects[uwep->otyp].oc_subtyp == '\x04';
  }
  pcVar6 = "chop through";
  if (bVar13) {
    pcVar6 = "dig into";
  }
  loc_00 = level->locations[digging.pos.x] + digging.pos.y;
  if (((((u._1052_1_ & 1) != 0) || (uwep == (obj *)0x0)) ||
      ((!bVar12 &&
       (((uwep->oclass != '\x02' && (uwep->oclass != '\x06')) ||
        (objects[uwep->otyp].oc_subtyp != '\x03')))))) ||
     (bVar2 = on_level(&digging.level,&u.uz), bVar2 == '\0')) {
    return 0;
  }
  if (digging.down == '\0') {
    iVar4 = dist2((int)x,(int)y,(int)u.ux,(int)u.uy);
    if (2 < iVar4) {
      return 0;
    }
  }
  else {
    if (x != u.ux) {
      return 0;
    }
    if (y != u.uy) {
      return 0;
    }
  }
  if (digging.down == '\0') {
    if ((((loc_00->typ == '\r') ||
         (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 && (loc_00->typ == '\0')))) ||
        (loc_00->typ == '\x0e')) &&
       ((bVar2 = may_dig(level,x,y), bVar2 == '\0' && (iVar4 = dig_typ(uwep,x,y), iVar4 == 5)))) {
      pline("This tree seems to be petrified.");
      return 0;
    }
    if ((((loc_00->typ < '\x11') && (bVar2 = may_dig(level,x,y), bVar2 == '\0')) &&
        (iVar4 = dig_typ(uwep,x,y), iVar4 == 1)) ||
       ((loc_00->typ == '\x17' && (iVar4 = artifact_door(level,(int)x,(int)y), iVar4 != 0)))) {
      pcVar7 = "wall";
      if (loc_00->typ == '\x17') {
        pcVar7 = "door";
      }
      pline("This %s is too hard to %s.",pcVar7,pcVar6);
      return 0;
    }
  }
  else {
    bVar2 = dig_check(&youmonst,'\x01',(int)u.ux,(int)u.uy);
    if (bVar2 == '\0') {
      return 0;
    }
  }
  if (((u.uprops[0x25].intrinsic != 0) || (u.uprops[0x25].extrinsic != 0)) &&
     (iVar4 = rn2(3), iVar4 == 0)) {
    iVar4 = rn2(3);
    if (iVar4 == 0) {
      iVar4 = welded(uwep);
      if (iVar4 == 0) {
        pcVar6 = xname(uwep);
        pline("You fumble and drop your %s.",pcVar6);
        dropx(uwep);
      }
      else {
        if (u.usteed == (monst *)0x0) {
          pcVar6 = xname(uwep);
          pcVar7 = otense(uwep,"bounce");
          pcVar8 = otense(uwep,"hit");
          pline("Ouch!  Your %s %s and %s you!",pcVar6,pcVar7,pcVar8);
        }
        else {
          pcVar6 = xname(uwep);
          pcVar7 = otense(uwep,"bounce");
          pcVar8 = otense(uwep,"hit");
          pcVar9 = mon_nam(u.usteed);
          pline("Your %s %s and %s %s!",pcVar6,pcVar7,pcVar8,pcVar9);
        }
        iVar4 = rnd(5);
        set_wounded_legs(0x40000,iVar4 + 5);
      }
    }
    else if (iVar4 == 1) {
      pcVar6 = xname(uwep);
      pcVar6 = the(pcVar6);
      pline("Bang!  You hit with the broad side of %s!",pcVar6);
    }
    else {
      pline("Your swing misses its mark.");
    }
    return 0;
  }
  iVar4 = rn2(5);
  iVar5 = abon();
  if ((*(uint *)&uwep->field_0x4a >> 10 & 3) < (*(uint *)&uwep->field_0x4a >> 8 & 3)) {
    local_a4 = *(uint *)&uwep->field_0x4a >> 8;
  }
  else {
    local_a4 = *(uint *)&uwep->field_0x4a >> 10;
  }
  local_a4 = local_a4 & 3;
  digging.effort =
       ((iVar4 + 10 + iVar5 + (int)uwep->spe) - local_a4) + (int)u.udaminc + digging.effort;
  if (urace.malenum == 0x2d) {
    digging.effort = digging.effort * 2;
  }
  if (loc_00->typ == '\x0e') {
    digging.effort = digging.effort << 1;
  }
  if (digging.down == '\0') {
    if (digging.effort < 0x65) {
      iVar4 = dig_typ(uwep,x,y);
      if (((loc_00->typ == '\0') || ('\f' < loc_00->typ)) && (iVar4 != 4)) {
        if (('\x10' < loc_00->typ) && (iVar4 == 1)) {
          return 0;
        }
      }
      else {
        pcVar7 = in_rooms(level,x,y,0x12);
        if (*pcVar7 != '\0') {
          pcVar7 = "wall";
          if (loc_00->typ == '\x17') {
            pcVar7 = "door";
          }
          pline("This %s seems too hard to %s.",pcVar7,pcVar6);
          return 0;
        }
      }
      if (did_dig_msg == '\0') {
        pline("You hit the %s with all your might.",dig::d_target[iVar4]);
        did_dig_msg = '\x01';
      }
      return 1;
    }
    obj = (obj *)0x0;
    pcVar6 = in_rooms(level,x,y,0x12);
    cVar1 = *pcVar6;
    poVar11 = sobj_at(0x215,level,(int)x,(int)y);
    if (poVar11 == (obj *)0x0) {
      poVar11 = sobj_at(0x214,level,(int)x,(int)y);
      if (poVar11 == (obj *)0x0) {
        if ((((loc_00->typ == '\0') || (loc_00->typ == '\x10')) || (loc_00->typ == '\r')) ||
           ((((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 && (loc_00->typ == '\0')) ||
            (loc_00->typ == '\x0e')))) {
          bVar2 = on_level(&u.uz,&dungeon_topology.d_earth_level);
          if (bVar2 != '\0') {
            if (((*(uint *)&uwep->field_0x4a >> 1 & 1) != 0) && (iVar4 = rn2(3), iVar4 == 0)) {
              mkcavearea('\0');
              digging.lastdigtime = moves;
              digging.level.dnum = '\0';
              digging.level.dlevel = -1;
              digging.quiet = '\0';
              return 0;
            }
            if ((((*(uint *)&uwep->field_0x4a & 1) != 0) && (iVar4 = rn2(4), iVar4 == 0)) ||
               (((*(uint *)&uwep->field_0x4a >> 1 & 1) == 0 && (iVar4 = rn2(6), iVar4 == 0)))) {
              mkcavearea('\x01');
              digging.lastdigtime = moves;
              digging.level.dnum = '\0';
              digging.level.dlevel = -1;
              digging.quiet = '\0';
              return 0;
            }
          }
          if ((loc_00->typ == '\r') ||
             ((((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 && (loc_00->typ == '\0')) ||
              (loc_00->typ == '\x0e')))) {
            dmgtxt = "You cut down the tree.";
            loc_00->typ = '\x19';
            iVar4 = rn2(5);
            if (iVar4 == 0) {
              rnd_treefruit_at((int)x,(int)y);
            }
          }
          else {
            dmgtxt = "You succeed in cutting away some rock.";
            loc_00->typ = '\x18';
          }
        }
        else if ((loc_00->typ == '\0') || ('\f' < loc_00->typ)) {
          if (loc_00->typ == '\x0f') {
            cvt_sdoor_to_door(loc_00,&u.uz);
            dmgtxt = "You break through a secret door!";
            if ((*(uint *)&loc_00->field_0x6 >> 4 & 0x10) == 0) {
              *(uint *)&loc_00->field_0x6 = *(uint *)&loc_00->field_0x6 & 0xfffffe0f | 0x10;
            }
          }
          else {
            bVar2 = closed_door(level,(int)x,(int)y);
            if (bVar2 == '\0') {
              return 0;
            }
            dmgtxt = "You break through the door.";
            if (cVar1 != '\0') {
              add_damage(x,y,400);
              obj = (obj *)anon_var_dwarf_18dee;
            }
            if ((*(uint *)&loc_00->field_0x6 >> 4 & 0x10) == 0) {
              *(uint *)&loc_00->field_0x6 = *(uint *)&loc_00->field_0x6 & 0xfffffe0f | 0x10;
            }
          }
        }
        else {
          if (cVar1 != '\0') {
            sVar3 = acurrstr();
            add_damage(x,y,(long)sVar3 * 10);
            obj = (obj *)0x37897e;
          }
          if ((*(uint *)&(level->flags).field_0x8 >> 0x11 & 1) == 0) {
            if (((*(uint *)&(level->flags).field_0x8 >> 0x13 & 1) == 0) ||
               (bVar2 = in_town((int)x,(int)y), bVar2 != '\0')) {
              loc_00->typ = '\x17';
              *(uint *)&loc_00->field_0x6 = *(uint *)&loc_00->field_0x6 & 0xfffffe0f;
            }
            else {
              loc_00->typ = '\x18';
            }
          }
          else {
            loc_00->typ = '\x19';
          }
          dmgtxt = "You make an opening in the wall.";
        }
      }
      else {
        fracture_rock(poVar11);
        poVar11 = sobj_at(0x214,level,(int)x,(int)y);
        if (poVar11 != (obj *)0x0) {
          obj_extract_self(poVar11);
          place_object(poVar11,level,(int)x,(int)y);
        }
        dmgtxt = "The boulder falls apart.";
      }
    }
    else {
      bVar2 = break_statue(poVar11);
      if (bVar2 == '\0') {
        dmgtxt = (char *)0x0;
      }
      else {
        dmgtxt = "The statue shatters.";
      }
    }
    bVar2 = does_block(level,(int)x,(int)y,(monst *)0x0);
    if (bVar2 == '\0') {
      unblock_point((int)x,(int)y);
    }
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      newsym((int)x,(int)y);
    }
    else {
      feel_location(x,y);
    }
    if ((dmgtxt != (char *)0x0) && (digging.quiet == '\0')) {
      pline(dmgtxt);
    }
    if (obj != (obj *)0x0) {
      pay_for_damage((char *)obj,'\0');
    }
    bVar2 = on_level(&u.uz,&dungeon_topology.d_earth_level);
    if ((bVar2 != '\0') && (iVar4 = rn2(3), iVar4 == 0)) {
      iVar4 = rn2(2);
      if (iVar4 == 0) {
        pmStack_60 = makemon(mons + 0xa1,level,(int)x,(int)y,0);
      }
      else {
        pmStack_60 = makemon(mons + 0xee,level,(int)x,(int)y,0);
      }
      if (pmStack_60 != (monst *)0x0) {
        pline("The debris from your digging comes to life!");
      }
    }
    if ((loc_00->typ == '\x17') && ((*(uint *)&loc_00->field_0x6 >> 4 & 0x10) != 0)) {
      *(uint *)&loc_00->field_0x6 = *(uint *)&loc_00->field_0x6 & 0xfffffe0f;
      b_trapped("door",0);
      newsym((int)x,(int)y);
    }
    digging.lastdigtime = moves;
    digging.level.dnum = '\0';
    digging.level.dlevel = -1;
    digging.quiet = '\0';
    return 0;
  }
  if (0xfa < digging.effort) {
    dighole('\0');
    memset(&digging,0,0x10);
    return 0;
  }
  if ((0x32 < digging.effort) &&
     ((ptVar10 = t_at(level,(int)x,(int)y), ptVar10 == (trap *)0x0 ||
      (((((ptVar10->field_0x8 & 0x1f) != 0xb && ((ptVar10->field_0x8 & 0x1f) != 0xc)) &&
        ((ptVar10->field_0x8 & 0x1f) != 0xe)) && ((ptVar10->field_0x8 & 0x1f) != 0xd)))))) {
    if (loc_00->typ == '!') {
      altar_wrath((int)x,(int)y);
      angry_priest();
    }
    bVar2 = dighole('\x01');
    if (bVar2 != '\0') {
      digging.level.dnum = '\0';
      digging.level.dlevel = -1;
    }
    return 0;
  }
  return 1;
}

Assistant:

static int dig(void)
{
	struct rm *loc;
	xchar dpx = digging.pos.x, dpy = digging.pos.y;
	boolean ispick = uwep && is_pick(uwep);
	const char *verb =
	    (!uwep || is_pick(uwep)) ? "dig into" : "chop through";

	loc = &level->locations[dpx][dpy];
	/* perhaps a nymph stole your pick-axe while you were busy digging */
	/* or perhaps you teleported away */
	if (u.uswallow || !uwep || (!ispick && !is_axe(uwep)) ||
	    !on_level(&digging.level, &u.uz) ||
	    ((digging.down ? (dpx != u.ux || dpy != u.uy)
			   : (distu(dpx,dpy) > 2))))
		return 0;

	if (digging.down) {
	    if (!dig_check(BY_YOU, TRUE, u.ux, u.uy)) return 0;
	} else { /* !digging.down */
	    if (IS_TREES(level, loc->typ) && !may_dig(level, dpx,dpy) &&
			dig_typ(uwep, dpx, dpy) == DIGTYP_TREE) {
		pline("This tree seems to be petrified.");
		return 0;
	    }
	    /* ALI - Artifact doors */
	    if ((IS_ROCK(loc->typ) && !may_dig(level, dpx,dpy) &&
			dig_typ(uwep, dpx, dpy) == DIGTYP_ROCK) ||
			(IS_DOOR(loc->typ) && artifact_door(level, dpx, dpy))) {
		pline("This %s is too hard to %s.",
		      IS_DOOR(loc->typ) ? "door" : "wall", verb);
		return 0;
	    }
	}
	if (Fumbling && !rn2(3)) {
	    switch(rn2(3)) {
	    case 0:
		if (!welded(uwep)) {
		    pline("You fumble and drop your %s.", xname(uwep));
		    dropx(uwep);
		} else {
		    if (u.usteed)
			pline("Your %s %s and %s %s!",
			     xname(uwep),
			     otense(uwep, "bounce"), otense(uwep, "hit"),
			     mon_nam(u.usteed));
		    else
			pline("Ouch!  Your %s %s and %s you!",
			      xname(uwep),
			      otense(uwep, "bounce"), otense(uwep, "hit"));
		    set_wounded_legs(RIGHT_SIDE, 5 + rnd(5));
		}
		break;
	    case 1:
		pline("Bang!  You hit with the broad side of %s!",
		      the(xname(uwep)));
		break;
	    default: pline("Your swing misses its mark.");
		break;
	    }
	    return 0;
	}

	digging.effort += 10 + rn2(5) + abon() +
			   uwep->spe - greatest_erosion(uwep) + u.udaminc;
	if (Race_if(PM_DWARF))
	    digging.effort *= 2;
	if (loc->typ == DEADTREE)
	    digging.effort *= 2;
	if (digging.down) {
		struct trap *ttmp;

		if (digging.effort > 250) {
		    dighole(FALSE);
		    memset(&digging, 0, sizeof digging);
		    return 0;	/* done with digging */
		}

		if (digging.effort <= 50 ||
		    ((ttmp = t_at(level, dpx,dpy)) != 0 &&
			(ttmp->ttyp == PIT || ttmp->ttyp == SPIKED_PIT ||
			 ttmp->ttyp == TRAPDOOR || ttmp->ttyp == HOLE)))
		    return 1;

		if (IS_ALTAR(loc->typ)) {
		    altar_wrath(dpx, dpy);
		    angry_priest();
		}

		if (dighole(TRUE)) {	/* make pit at <u.ux,u.uy> */
		    digging.level.dnum = 0;
		    digging.level.dlevel = -1;
		}
		return 0;
	}

	if (digging.effort > 100) {
		const char *digtxt, *dmgtxt = NULL;
		struct obj *obj;
		boolean shopedge = *in_rooms(level, dpx, dpy, SHOPBASE);

		if ((obj = sobj_at(STATUE, level, dpx, dpy)) != 0) {
			if (break_statue(obj))
				digtxt = "The statue shatters.";
			else
				/* it was a statue trap; break_statue()
				 * printed a message and updated the screen
				 */
				digtxt = NULL;
		} else if ((obj = sobj_at(BOULDER, level, dpx, dpy)) != 0) {
			struct obj *bobj;

			fracture_rock(obj);
			if ((bobj = sobj_at(BOULDER, level, dpx, dpy)) != 0) {
			    /* another boulder here, restack it to the top */
			    obj_extract_self(bobj);
			    place_object(bobj, level, dpx, dpy);
			}
			digtxt = "The boulder falls apart.";
		} else if (loc->typ == STONE || loc->typ == SCORR ||
				IS_TREES(level, loc->typ)) {
			if (Is_earthlevel(&u.uz)) {
			    if (uwep->blessed && !rn2(3)) {
				mkcavearea(FALSE);
				goto cleanup;
			    } else if ((uwep->cursed && !rn2(4)) ||
					  (!uwep->blessed && !rn2(6))) {
				mkcavearea(TRUE);
				goto cleanup;
			    }
			}
			if (IS_TREES(level, loc->typ)) {
			    digtxt = "You cut down the tree.";
			    loc->typ = ROOM;
			    if (!rn2(5)) rnd_treefruit_at(dpx, dpy);
			} else {
			    digtxt = "You succeed in cutting away some rock.";
			    loc->typ = CORR;
			}
		} else if (IS_WALL(loc->typ)) {
			if (shopedge) {
			    add_damage(dpx, dpy, 10L * ACURRSTR);
			    dmgtxt = "damage";
			}
			if (level->flags.is_maze_lev) {
			    loc->typ = ROOM;
			} else if (level->flags.is_cavernous_lev &&
				   !in_town(dpx, dpy)) {
			    loc->typ = CORR;
			} else {
			    loc->typ = DOOR;
			    loc->doormask = D_NODOOR;
			}
			digtxt = "You make an opening in the wall.";
		} else if (loc->typ == SDOOR) {
			cvt_sdoor_to_door(loc, &u.uz);	/* ->typ = DOOR */
			digtxt = "You break through a secret door!";
			if (!(loc->doormask & D_TRAPPED))
				loc->doormask = D_BROKEN;
		} else if (closed_door(level, dpx, dpy)) {
			digtxt = "You break through the door.";
			if (shopedge) {
			    add_damage(dpx, dpy, 400L);
			    dmgtxt = "break";
			}
			if (!(loc->doormask & D_TRAPPED))
				loc->doormask = D_BROKEN;
		} else return 0; /* statue or boulder got taken */

		if (!does_block(level, dpx, dpy, NULL))
		    unblock_point(dpx,dpy);	/* vision:  can see through */
		if (Blind)
		    feel_location(dpx, dpy);
		else
		    newsym(dpx, dpy);
		if (digtxt && !digging.quiet) pline(digtxt); /* after newsym */
		if (dmgtxt)
		    pay_for_damage(dmgtxt, FALSE);

		if (Is_earthlevel(&u.uz) && !rn2(3)) {
		    struct monst *mtmp;

		    switch(rn2(2)) {
		      case 0:
			mtmp = makemon(&mons[PM_EARTH_ELEMENTAL], level,
					dpx, dpy, NO_MM_FLAGS);
			break;
		      default:
			mtmp = makemon(&mons[PM_XORN], level,
					dpx, dpy, NO_MM_FLAGS);
			break;
		    }
		    if (mtmp) pline("The debris from your digging comes to life!");
		}
		if (IS_DOOR(loc->typ) && (loc->doormask & D_TRAPPED)) {
			loc->doormask = D_NODOOR;
			b_trapped("door", 0);
			newsym(dpx, dpy);
		}
cleanup:
		digging.lastdigtime = moves;
		digging.quiet = FALSE;
		digging.level.dnum = 0;
		digging.level.dlevel = -1;
		return 0;
	} else {		/* not enough effort has been spent yet */
		static const char *const d_target[6] = {
			"", "rock", "statue", "boulder", "door", "tree"
		};
		int dig_target = dig_typ(uwep, dpx, dpy);

		if (IS_WALL(loc->typ) || dig_target == DIGTYP_DOOR) {
		    if (*in_rooms(level, dpx, dpy, SHOPBASE)) {
			pline("This %s seems too hard to %s.",
			      IS_DOOR(loc->typ) ? "door" : "wall", verb);
			return 0;
		    }
		} else if (!IS_ROCK(loc->typ) && dig_target == DIGTYP_ROCK)
		    return 0; /* statue or boulder got taken */
		if (!did_dig_msg) {
		    pline("You hit the %s with all your might.",
			d_target[dig_target]);
		    did_dig_msg = TRUE;
		}
	}
	return 1;
}